

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ConfigError::ConfigError(ConfigError *this,string *msg)

{
  string local_70;
  allocator local_39;
  string local_38;
  string *local_18;
  string *msg_local;
  ConfigError *this_local;
  
  local_18 = msg;
  msg_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_38,"ConfigError",&local_39);
  ::std::__cxx11::string::string((string *)&local_70,(string *)msg);
  ConfigError(this,&local_38,&local_70,ConfigError);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

static ConfigError NotConfigurable(std::string item) {
        return ConfigError(item + ": This option is not allowed in a configuration file");
    }